

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::Renderer::renderStockPileCoveredCards
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex,
          StockPileCollider *collider)

{
  int iVar1;
  Position coveredCardsPosition;
  Position cardPosition;
  StockPileCollider *collider_local;
  SelectedCardIndex *selectedCardIndex_local;
  Cards *pileCards_local;
  Renderer *this_local;
  
  coveredCardsPosition.x = 0x10;
  coveredCardsPosition.y = 0x1e;
  iVar1 = (*collider->_vptr_StockPileCollider[4])();
  while (coveredCardsPosition.x <= iVar1) {
    renderCardBack(this,&coveredCardsPosition);
    coveredCardsPosition.x = coveredCardsPosition.x + 2;
  }
  return;
}

Assistant:

void Renderer::renderStockPileCoveredCards(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex,
    const StockPileCollider& collider) const
{
    auto cardPosition = Layout::stockPilePosition;
    const auto coveredCardsPosition = collider.getCoveredCardsPosition();

    while (cardPosition.x <= coveredCardsPosition.x) {
        renderCardBack(cardPosition);
        cardPosition.x += Layout::stockPileCardsSpacing;
    }
}